

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O3

void fl_frame(char *s,int x,int y,int w,int h)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uchar *puVar6;
  int iVar7;
  ulong local_50;
  
  puVar6 = " !\"#$%&\'()*+,-./01234567";
  if (draw_it_active == 0) {
    puVar6 = "++,,,--...//000111223344";
  }
  if (0 < w && 0 < h) {
    uVar2 = (ulong)(uint)x;
    local_50 = (ulong)(w - 1);
    iVar3 = y + -2;
    iVar4 = y + -1;
    iVar7 = 0;
    lVar5 = 0;
    do {
      if ((long)s[lVar5 * 4] == 0) {
        return;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)puVar6[(long)s[lVar5 * 4] + -0x41]);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,uVar2 + lVar5 & 0xffffffff,(ulong)(uint)y + lVar5);
      if (h + iVar7 < 2) {
        return;
      }
      uVar1 = (ulong)(uint)y + 1 + lVar5;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)puVar6[(long)s[lVar5 * 4 + 1] + -0x41]);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,uVar2 + lVar5 & 0xffffffff,(ulong)(uint)(h + iVar4),
                 uVar1 & 0xffffffff);
      if (w + iVar7 < 2) {
        return;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)puVar6[(long)s[lVar5 * 4 + 2] + -0x41]);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                (fl_graphics_driver,uVar2 + 1 + lVar5 & 0xffffffff,(ulong)(uint)(h + iVar4),
                 uVar2 + local_50);
      if (h + iVar7 == 2) {
        return;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)puVar6[(long)s[lVar5 * 4 + 3] + -0x41]);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                (fl_graphics_driver,uVar2 + local_50,(ulong)(uint)(h + iVar3),uVar1);
      lVar5 = lVar5 + 1;
      local_50 = local_50 - 1;
      iVar3 = iVar3 + -1;
      iVar4 = iVar4 + -1;
      iVar7 = iVar7 + -2;
    } while (w + iVar7 != 0);
  }
  return;
}

Assistant:

void fl_frame(const char* s, int x, int y, int w, int h) {
  const uchar *g = fl_gray_ramp();
  if (h > 0 && w > 0) for (;*s;) {
    // draw top line:
    fl_color(g[(int)*s++]);
    fl_xyline(x, y, x+w-1);
    y++; if (--h <= 0) break;
    // draw left line:
    fl_color(g[(int)*s++]);
    fl_yxline(x, y+h-1, y);
    x++; if (--w <= 0) break;
    // draw bottom line:
    fl_color(g[(int)*s++]);
    fl_xyline(x, y+h-1, x+w-1);
    if (--h <= 0) break;
    // draw right line:
    fl_color(g[(int)*s++]);
    fl_yxline(x+w-1, y+h-1, y);
    if (--w <= 0) break;
  }
}